

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O1

void jpc_irct(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  int iVar1;
  int iVar2;
  jas_seqent_t **ppjVar3;
  jas_seqent_t **ppjVar4;
  jas_seqent_t **ppjVar5;
  jas_seqent_t *pjVar6;
  jas_seqent_t *pjVar7;
  jas_seqent_t *pjVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  uVar9 = (uint)c0->numrows_;
  if (c1->numrows_ == (long)(int)uVar9) {
    iVar10 = (int)c0->numcols_;
    if (((c1->numcols_ == (long)iVar10) && (c2->numrows_ == (long)(int)uVar9)) &&
       (c2->numcols_ == (long)iVar10)) {
      if (0 < (int)uVar9) {
        ppjVar3 = c0->rows_;
        ppjVar4 = c1->rows_;
        ppjVar5 = c2->rows_;
        uVar12 = 0;
        do {
          if (0 < iVar10) {
            pjVar6 = ppjVar5[uVar12];
            pjVar7 = ppjVar4[uVar12];
            pjVar8 = ppjVar3[uVar12];
            lVar13 = 0;
            iVar11 = iVar10 + 1;
            do {
              iVar1 = *(int *)((long)pjVar7 + lVar13);
              iVar2 = *(int *)((long)pjVar6 + lVar13);
              iVar14 = *(int *)((long)pjVar8 + lVar13) - (int)((ulong)(long)(iVar1 + iVar2) >> 2);
              *(long *)((long)pjVar8 + lVar13) = (long)(iVar2 + iVar14);
              *(long *)((long)pjVar7 + lVar13) = (long)iVar14;
              *(long *)((long)pjVar6 + lVar13) = (long)(iVar1 + iVar14);
              iVar11 = iVar11 + -1;
              lVar13 = lVar13 + 8;
            } while (1 < iVar11);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uVar9 & 0x7fffffff));
      }
      return;
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0x93,"void jpc_irct(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_irct(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	numcols = jas_matrix_numcols(c0);

	/* All three matrices must have the same dimensions. */
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols
	  && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols);

	for (i = 0; i < numrows; i++) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			int r;
			int g;
			int b;
			int y;
			int u;
			int v;
			y = *c0p;
			u = *c1p;
			v = *c2p;
			//g = y - ((u + v) >> 2);
			g = y - jpc_fix_asr(u + v, 2);
			r = v + g;
			b = u + g;
			*c0p++ = r;
			*c1p++ = g;
			*c2p++ = b;
		}
	}
}